

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.h
# Opt level: O0

void __thiscall
absl::strings_internal::BigUnsigned<84>::MultiplyByTenToTheNth(BigUnsigned<84> *this,int n)

{
  int in_ESI;
  undefined8 in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_ESI < 10) {
    if (0 < in_ESI) {
      MultiplyBy(this,n);
    }
  }
  else {
    MultiplyByFiveToTheNth
              ((BigUnsigned<84> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
               (int)((ulong)in_RDI >> 0x20));
    ShiftLeft(this,n);
  }
  return;
}

Assistant:

void MultiplyByTenToTheNth(int n) {
    if (n > kMaxSmallPowerOfTen) {
      // For large n, raise to a power of 5, then shift left by the same amount.
      // (10**n == 5**n * 2**n.)  This requires fewer multiplications overall.
      MultiplyByFiveToTheNth(n);
      ShiftLeft(n);
    } else if (n > 0) {
      // We can do this more quickly for very small N by using a single
      // multiplication.
      MultiplyBy(kTenToNth[n]);
    }
  }